

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall
cmCacheManager::ReadPropertyEntry(cmCacheManager *this,string *entryKey,CacheEntry *e)

{
  ulong uVar1;
  pointer pcVar2;
  char *__s;
  cmCacheManager *pcVar3;
  int iVar4;
  size_t sVar5;
  mapped_type *this_00;
  char **ppcVar6;
  CacheIterator it;
  string key;
  allocator local_91;
  CacheEntry *local_90;
  cmCacheManager *local_88;
  string local_80;
  CacheIterator local_60;
  key_type local_50;
  
  if (e->Type == INTERNAL) {
    uVar1 = entryKey->_M_string_length;
    pcVar2 = (entryKey->_M_dataplus)._M_p;
    local_90 = e;
    local_88 = this;
    for (ppcVar6 = PersistentProperties; __s = *ppcVar6, __s != (char *)0x0; ppcVar6 = ppcVar6 + 1)
    {
      sVar5 = strlen(__s);
      if (((sVar5 + 1 < uVar1) && (pcVar2[~sVar5 + uVar1] == '-')) &&
         (iVar4 = strcmp(pcVar2 + ~sVar5 + uVar1 + 1,__s), iVar4 == 0)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)entryKey);
        pcVar3 = local_88;
        local_60 = GetCacheIterator(local_88,local_50._M_dataplus._M_p);
        if ((_Rb_tree_header *)local_60.Position._M_node._M_node ==
            &((local_60.Container)->Cache)._M_t._M_impl.super__Rb_tree_header) {
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                    ::operator[](&pcVar3->Cache,&local_50);
          this_00->Type = UNINITIALIZED;
          std::__cxx11::string::string((string *)&local_80,*ppcVar6,&local_91);
          CacheEntry::SetProperty(this_00,&local_80,(local_90->Value)._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::string((string *)&local_80,*ppcVar6,&local_91);
          CacheIterator::SetProperty(&local_60,&local_80,(local_90->Value)._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_50);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool cmCacheManager::ReadPropertyEntry(std::string const& entryKey,
                                       CacheEntry& e)
{
  // All property entries are internal.
  if (e.Type != cmStateEnums::INTERNAL) {
    return false;
  }

  const char* end = entryKey.c_str() + entryKey.size();
  for (const char** p = this->PersistentProperties; *p; ++p) {
    std::string::size_type plen = strlen(*p) + 1;
    if (entryKey.size() > plen && *(end - plen) == '-' &&
        strcmp(end - plen + 1, *p) == 0) {
      std::string key = entryKey.substr(0, entryKey.size() - plen);
      cmCacheManager::CacheIterator it = this->GetCacheIterator(key.c_str());
      if (it.IsAtEnd()) {
        // Create an entry and store the property.
        CacheEntry& ne = this->Cache[key];
        ne.Type = cmStateEnums::UNINITIALIZED;
        ne.SetProperty(*p, e.Value.c_str());
      } else {
        // Store this property on its entry.
        it.SetProperty(*p, e.Value.c_str());
      }
      return true;
    }
  }
  return false;
}